

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanodetplus_pnnx.cpp
# Opt level: O3

void generate_proposals(Mat *pred,int stride,Mat *in_pad,float prob_threshold,
                       vector<Object,_std::allocator<Object>_> *objects)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  int *piVar6;
  Layer *pLVar7;
  void *pvVar8;
  uint uVar9;
  float *pfVar10;
  ulong uVar11;
  undefined4 *puVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float pred_ltrb [4];
  Option opt;
  long local_130;
  ParamDict local_118;
  ulong local_108;
  long local_100;
  long local_f8;
  ulong local_f0;
  ulong local_e8;
  Mat *local_e0;
  Mat local_d8;
  undefined1 local_88 [16];
  undefined1 local_70 [12];
  float fStack_64;
  int local_60;
  float local_5c;
  bool local_49;
  
  local_f8 = (long)pred->h;
  iVar2 = pred->c;
  iVar1 = iVar2 + -0x4d;
  if (-1 < iVar2 + -0x50) {
    iVar1 = iVar2 + -0x50;
  }
  if (0 < local_f8) {
    uVar9 = iVar1 >> 2;
    local_e8 = (ulong)uVar9;
    local_108 = (ulong)(uint)pred->w;
    local_f0 = (ulong)(uVar9 * 4);
    if ((int)(uVar9 * 4) < 2) {
      local_f0 = 1;
    }
    uVar5 = 1;
    if (1 < (int)uVar9) {
      uVar5 = uVar9;
    }
    local_130 = 0;
    local_e0 = in_pad;
    do {
      if (0 < (int)local_108) {
        local_88 = ZEXT416((uint)(float)((int)local_130 * stride));
        local_100 = 0;
        uVar15 = 0;
        do {
          pfVar10 = (float *)(local_130 * pred->elemsize * (long)pred->w + local_100 +
                             (long)pred->data);
          uVar14 = 0xffffffff;
          uVar11 = 0;
          fVar16 = -3.4028235e+38;
          do {
            if (fVar16 < *pfVar10) {
              uVar14 = uVar11 & 0xffffffff;
              fVar16 = *pfVar10;
            }
            uVar11 = uVar11 + 1;
            pfVar10 = (float *)((long)pfVar10 + pred->elemsize * pred->cstep);
          } while (uVar11 != 0x50);
          fVar16 = expf(-fVar16);
          fVar16 = 1.0 / (fVar16 + 1.0);
          if (0.4 <= fVar16) {
            local_d8.cstep = 0;
            local_d8.data = (void *)0x0;
            local_d8.refcount._0_4_ = 0;
            local_d8.refcount._4_4_ = 0;
            local_d8.elemsize._0_4_ = 0;
            local_d8.elemsize._4_4_ = 0;
            local_d8.elempack = 0;
            local_d8.h = 0;
            local_d8.d = 0;
            local_d8.c = 0;
            local_d8.allocator = (Allocator *)0x0;
            local_d8.dims = 0;
            local_d8.w = 0;
            ncnn::Mat::create(&local_d8,(int)local_e8,4,4,(Allocator *)0x0);
            if (0x53 < iVar2) {
              sVar3 = pred->elemsize;
              sVar4 = pred->cstep;
              puVar12 = (undefined4 *)
                        ((sVar4 * 0x50 + pred->w * local_130) * sVar3 + local_100 + (long)pred->data
                        );
              uVar11 = 0;
              do {
                *(undefined4 *)((long)local_d8.data + uVar11 * 4) = *puVar12;
                uVar11 = uVar11 + 1;
                puVar12 = (undefined4 *)((long)puVar12 + sVar4 * sVar3);
              } while (local_f0 != uVar11);
            }
            pLVar7 = ncnn::create_layer("Softmax");
            ncnn::ParamDict::ParamDict(&local_118);
            ncnn::ParamDict::set(&local_118,0,1);
            ncnn::ParamDict::set(&local_118,1,1);
            (*pLVar7->_vptr_Layer[2])(pLVar7,&local_118);
            ncnn::Option::Option((Option *)local_70);
            local_70._4_4_ = 1.4013e-45;
            local_49 = false;
            (*pLVar7->_vptr_Layer[4])(pLVar7,(Option *)local_70);
            (*pLVar7->_vptr_Layer[9])(pLVar7,&local_d8,(Option *)local_70);
            (*pLVar7->_vptr_Layer[5])(pLVar7);
            (*pLVar7->_vptr_Layer[1])(pLVar7);
            ncnn::ParamDict::~ParamDict(&local_118);
            lVar13 = 0;
            pvVar8 = local_d8.data;
            do {
              fVar17 = 0.0;
              if (0x53 < iVar2) {
                uVar11 = 0;
                do {
                  fVar17 = fVar17 + (float)(int)uVar11 * *(float *)((long)pvVar8 + uVar11 * 4);
                  uVar11 = uVar11 + 1;
                } while (uVar5 != uVar11);
              }
              *(float *)((long)&local_118._vptr_ParamDict + lVar13 * 4) = fVar17 * (float)stride;
              lVar13 = lVar13 + 1;
              pvVar8 = (void *)((long)pvVar8 +
                               (long)local_d8.w *
                               CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize));
            } while (lVar13 != 4);
            fVar17 = (float)((int)uVar15 * stride);
            local_70._0_4_ = fVar17 - SUB84(local_118._vptr_ParamDict,0);
            local_70._4_4_ =
                 (float)local_88._0_4_ - (float)((ulong)local_118._vptr_ParamDict >> 0x20);
            local_70._8_4_ = (SUB84(local_118.d,0) + fVar17) - (float)local_70._0_4_;
            fStack_64 = ((float)((ulong)local_118.d >> 0x20) + (float)local_88._0_4_) -
                        (float)local_70._4_4_;
            local_60 = (int)uVar14;
            local_5c = fVar16;
            std::vector<Object,_std::allocator<Object>_>::push_back
                      ((vector<Object,_std::allocator<Object>_> *)local_e0,(value_type *)local_70);
            piVar6 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (local_d8.allocator == (Allocator *)0x0) {
                  if (local_d8.data != (void *)0x0) {
                    free(local_d8.data);
                  }
                }
                else {
                  (*(local_d8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          uVar15 = uVar15 + 1;
          local_100 = local_100 + 4;
        } while (uVar15 != local_108);
      }
      local_130 = local_130 + 1;
    } while (local_130 != local_f8);
  }
  return;
}

Assistant:

static void generate_proposals(const ncnn::Mat& pred, int stride, const ncnn::Mat& in_pad, float prob_threshold, std::vector<Object>& objects)
{
    const int num_grid = pred.h;

    int num_grid_x = pred.w;
    int num_grid_y = pred.h;

    const int num_class = 80; // number of classes. 80 for COCO
    const int reg_max_1 = (pred.c - num_class) / 4;

    for (int i = 0; i < num_grid_y; i++)
    {
        for (int j = 0; j < num_grid_x; j++)
        {
            // find label with max score
            int label = -1;
            float score = -FLT_MAX;
            for (int k = 0; k < num_class; k++)
            {
                float s = pred.channel(k).row(i)[j];
                if (s > score)
                {
                    label = k;
                    score = s;
                }
            }

            score = sigmoid(score);

            if (score >= prob_threshold)
            {
                ncnn::Mat bbox_pred(reg_max_1, 4);
                for (int k = 0; k < reg_max_1 * 4; k++)
                {
                    bbox_pred[k] = pred.channel(num_class + k).row(i)[j];
                }
                {
                    ncnn::Layer* softmax = ncnn::create_layer("Softmax");

                    ncnn::ParamDict pd;
                    pd.set(0, 1); // axis
                    pd.set(1, 1);
                    softmax->load_param(pd);

                    ncnn::Option opt;
                    opt.num_threads = 1;
                    opt.use_packing_layout = false;

                    softmax->create_pipeline(opt);

                    softmax->forward_inplace(bbox_pred, opt);

                    softmax->destroy_pipeline(opt);

                    delete softmax;
                }

                float pred_ltrb[4];
                for (int k = 0; k < 4; k++)
                {
                    float dis = 0.f;
                    const float* dis_after_sm = bbox_pred.row(k);
                    for (int l = 0; l < reg_max_1; l++)
                    {
                        dis += l * dis_after_sm[l];
                    }

                    pred_ltrb[k] = dis * stride;
                }

                float pb_cx = j * stride;
                float pb_cy = i * stride;

                float x0 = pb_cx - pred_ltrb[0];
                float y0 = pb_cy - pred_ltrb[1];
                float x1 = pb_cx + pred_ltrb[2];
                float y1 = pb_cy + pred_ltrb[3];

                Object obj;
                obj.rect.x = x0;
                obj.rect.y = y0;
                obj.rect.width = x1 - x0;
                obj.rect.height = y1 - y0;
                obj.label = label;
                obj.prob = score;

                objects.push_back(obj);
            }
        }
    }
}